

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardShapes.cpp
# Opt level: O2

void Assimp::StandardShapes::MakeSphere
               (uint tess,vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *positions)

{
  pointer paVar1;
  pointer paVar2;
  uint uVar3;
  bool bVar4;
  
  paVar1 = (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  paVar2 = (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  uVar3 = integer_pow(4,tess);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
            (positions,(ulong)(uVar3 * 0x3c) + ((long)paVar1 - (long)paVar2) / 0xc);
  MakeIcosahedron(positions);
  while (bVar4 = tess != 0, tess = tess - 1, bVar4) {
    Subdivide(positions);
  }
  return;
}

Assistant:

void StandardShapes::MakeSphere(unsigned int    tess,
    std::vector<aiVector3D>& positions)
{
    // Reserve enough storage. Every subdivision
    // splits each triangle in 4, the icosahedron consists of 60 verts
    positions.reserve(positions.size()+60 * integer_pow(4, tess));

    // Construct an icosahedron to start with
    MakeIcosahedron(positions);

    // ... and subdivide it until the requested output
    // tessellation is reached
    for (unsigned int i = 0; i<tess;++i)
        Subdivide(positions);
}